

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

bool __thiscall glslang::TType::sameCoopMatShape(TType *this,TType *right)

{
  TVector<glslang::TArraySize> *pTVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint i;
  int iVar5;
  uint uVar6;
  
  uVar6 = *(uint *)&this->field_0x8;
  if ((uVar6 & 0x600000) == 0) {
    return false;
  }
  if ((*(uint *)&right->field_0x8 & 0x600000) == 0) {
LAB_0043d537:
    bVar2 = false;
  }
  else {
    iVar5 = 0;
    bVar2 = false;
    if (((*(uint *)&right->field_0x8 ^ uVar6) >> 0x16 & 1) == 0) {
      i = uVar6 >> 0x15 & 1;
      pTVar1 = (this->typeParameters->arraySizes->sizes).sizes;
      if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
        iVar5 = (int)((ulong)((long)(pTVar1->
                                    super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ).
                                    super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar1->
                                   super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ).
                                   super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
      }
      uVar6 = iVar5 - (uint)((uVar6 >> 0x16 & 1) != 0);
      bVar2 = (int)uVar6 <= (int)i;
      if ((int)i < (int)uVar6) {
        do {
          uVar3 = TSmallArrayVector::getDimSize(&this->typeParameters->arraySizes->sizes,i);
          uVar4 = TSmallArrayVector::getDimSize(&right->typeParameters->arraySizes->sizes,i);
          if (uVar3 != uVar4) goto LAB_0043d537;
          i = i + 1;
        } while (uVar6 != i);
        bVar2 = true;
      }
    }
  }
  return bVar2;
}

Assistant:

bool isCoopMat() const { return coopmatNV || coopmatKHR; }